

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

ogt_vox_transform *
sample_keyframe_transform
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_keyframe_transform *keyframes,
          uint32_t num_keyframes,bool loop,uint32_t frame_index)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  
  if (num_keyframes == 0) {
    __assert_fail("(num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x4f3,
                  "ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform *, uint32_t, bool, uint32_t)"
                 );
  }
  if (loop) {
    frame_index = compute_looped_frame_index
                            (keyframes->frame_index,keyframes[num_keyframes - 1].frame_index,
                             frame_index);
  }
  if (keyframes->frame_index < frame_index) {
    if (frame_index < keyframes[num_keyframes - 1].frame_index) {
      uVar21 = num_keyframes - 2;
      do {
        uVar22 = uVar21;
        if ((int)uVar22 < 0) {
          __assert_fail("(0) && (\"shouldn\'t reach here\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0x50d,
                        "ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform *, uint32_t, bool, uint32_t)"
                       );
        }
        uVar5 = keyframes[uVar22].frame_index;
        uVar21 = uVar22 - 1;
      } while (frame_index < uVar5);
      fVar23 = (float)(frame_index - uVar5) /
               (float)(keyframes[(ulong)uVar22 + 1].frame_index - uVar5);
      fVar24 = 1.0 - fVar23;
      fVar17 = keyframes[uVar22].transform.m00;
      fVar18 = keyframes[uVar22].transform.m01;
      fVar19 = keyframes[uVar22].transform.m02;
      fVar20 = keyframes[uVar22].transform.m03;
      fVar13 = keyframes[uVar22].transform.m10;
      fVar14 = keyframes[uVar22].transform.m11;
      fVar15 = keyframes[uVar22].transform.m12;
      fVar16 = keyframes[uVar22].transform.m13;
      fVar9 = keyframes[uVar22].transform.m20;
      fVar10 = keyframes[uVar22].transform.m21;
      fVar11 = keyframes[uVar22].transform.m22;
      fVar12 = keyframes[uVar22].transform.m23;
      fVar6 = keyframes[uVar22].transform.m31;
      fVar7 = keyframes[uVar22].transform.m32;
      fVar8 = keyframes[uVar22].transform.m33;
      __return_storage_ptr__->m30 = keyframes[uVar22].transform.m30;
      __return_storage_ptr__->m31 = fVar6;
      __return_storage_ptr__->m32 = fVar7;
      __return_storage_ptr__->m33 = fVar8;
      __return_storage_ptr__->m20 = fVar9;
      __return_storage_ptr__->m21 = fVar10;
      __return_storage_ptr__->m22 = fVar11;
      __return_storage_ptr__->m23 = fVar12;
      __return_storage_ptr__->m10 = fVar13;
      __return_storage_ptr__->m11 = fVar14;
      __return_storage_ptr__->m12 = fVar15;
      __return_storage_ptr__->m13 = fVar16;
      __return_storage_ptr__->m00 = fVar17;
      __return_storage_ptr__->m01 = fVar18;
      __return_storage_ptr__->m02 = fVar19;
      __return_storage_ptr__->m03 = fVar20;
      uVar1 = keyframes[(ulong)uVar22 + 1].transform.m30;
      uVar3 = keyframes[(ulong)uVar22 + 1].transform.m31;
      uVar2 = __return_storage_ptr__->m30;
      uVar4 = __return_storage_ptr__->m31;
      __return_storage_ptr__->m30 = (float)(int)(fVar23 * (float)uVar1 + fVar24 * (float)uVar2);
      __return_storage_ptr__->m31 = (float)(int)(fVar23 * (float)uVar3 + fVar24 * (float)uVar4);
      __return_storage_ptr__->m32 =
           (float)(int)(fVar23 * keyframes[(ulong)uVar22 + 1].transform.m32 +
                       fVar24 * __return_storage_ptr__->m32);
      return __return_storage_ptr__;
    }
    keyframes = keyframes + (num_keyframes - 1);
  }
  fVar17 = (keyframes->transform).m00;
  fVar18 = (keyframes->transform).m01;
  fVar19 = (keyframes->transform).m02;
  fVar20 = (keyframes->transform).m03;
  fVar13 = (keyframes->transform).m10;
  fVar14 = (keyframes->transform).m11;
  fVar15 = (keyframes->transform).m12;
  fVar16 = (keyframes->transform).m13;
  fVar9 = (keyframes->transform).m20;
  fVar10 = (keyframes->transform).m21;
  fVar11 = (keyframes->transform).m22;
  fVar12 = (keyframes->transform).m23;
  fVar6 = (keyframes->transform).m31;
  fVar7 = (keyframes->transform).m32;
  fVar8 = (keyframes->transform).m33;
  __return_storage_ptr__->m30 = (keyframes->transform).m30;
  __return_storage_ptr__->m31 = fVar6;
  __return_storage_ptr__->m32 = fVar7;
  __return_storage_ptr__->m33 = fVar8;
  __return_storage_ptr__->m20 = fVar9;
  __return_storage_ptr__->m21 = fVar10;
  __return_storage_ptr__->m22 = fVar11;
  __return_storage_ptr__->m23 = fVar12;
  __return_storage_ptr__->m10 = fVar13;
  __return_storage_ptr__->m11 = fVar14;
  __return_storage_ptr__->m12 = fVar15;
  __return_storage_ptr__->m13 = fVar16;
  __return_storage_ptr__->m00 = fVar17;
  __return_storage_ptr__->m01 = fVar18;
  __return_storage_ptr__->m02 = fVar19;
  __return_storage_ptr__->m03 = fVar20;
  return __return_storage_ptr__;
}

Assistant:

static ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform* keyframes, uint32_t num_keyframes, bool loop, uint32_t frame_index)
    {
        ogt_assert(num_keyframes >= 1, "need at least one keyframe to sample");
        if (loop) {
            frame_index = compute_looped_frame_index(keyframes[0].frame_index, keyframes[num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= keyframes[0].frame_index)
            return keyframes[0].transform;
        if (frame_index >= keyframes[num_keyframes-1].frame_index)
            return keyframes[num_keyframes-1].transform;
        for (int32_t f = (int32_t)num_keyframes-2; f >= 0; f--) {
            if (frame_index >= keyframes[f].frame_index) {
                // orientation always snaps
                uint32_t next_frame = keyframes[f+1].frame_index;
                uint32_t curr_frame = keyframes[f+0].frame_index;
                float t = (frame_index - curr_frame)  / (float)(next_frame - curr_frame);
                float t_inv = 1.0f - t;
                // orientation always snaps to the earlier frame
                ogt_vox_transform curr_transform = keyframes[f+0].transform;
                // position gets interpolated with rounding towards zero - TODO(jpaver) or should it be -INF?
                const ogt_vox_transform& next_transform = keyframes[f+1].transform;
                curr_transform.m30 = (float)(int32_t)((next_transform.m30 * t) + (curr_transform.m30 * t_inv));
                curr_transform.m31 = (float)(int32_t)((next_transform.m31 * t) + (curr_transform.m31 * t_inv));
                curr_transform.m32 = (float)(int32_t)((next_transform.m32 * t) + (curr_transform.m32 * t_inv));
                return curr_transform;

            }
        }
        ogt_assert(0, "shouldn't reach here");
        return keyframes[0].transform;
    }